

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_util.hpp
# Opt level: O0

string_view mserialize::detail::resolve_recursive_tag(string_view full_tag,string_view intro)

{
  string_view s;
  string_view sVar1;
  bool bVar2;
  size_type sVar3;
  const_reference pcVar4;
  size_t sVar5;
  const_pointer str;
  size_t in_RCX;
  char *in_RDX;
  string_view in_stack_00000000;
  size_t size;
  size_t intro_pos;
  undefined8 in_stack_ffffffffffffffb0;
  char *pcVar6;
  string_view local_30;
  string_view local_20;
  char *in_stack_fffffffffffffff0;
  string_view *in_stack_fffffffffffffff8;
  
  local_30._ptr = in_RDX;
  local_30._len = in_RCX;
  bVar2 = string_view::empty(&local_30);
  if (bVar2) {
    memset(&stack0xfffffffffffffff0,0,0x10);
    string_view::string_view((string_view *)&stack0xfffffffffffffff0);
  }
  else {
    do {
      bVar2 = string_view::empty(&local_20);
      if (((bVar2 ^ 0xffU) & 1) == 0) {
LAB_00113397:
        memset(&stack0xfffffffffffffff0,0,0x10);
        string_view::string_view((string_view *)&stack0xfffffffffffffff0);
        goto LAB_001133b2;
      }
      pcVar6 = local_30._ptr;
      sVar5 = local_30._len;
      sVar3 = string_view::find(in_stack_fffffffffffffff8,in_stack_00000000,
                                (size_type)in_stack_fffffffffffffff0);
      string_view::remove_prefix(&local_20,sVar3);
      sVar3 = string_view::size(&local_30);
      string_view::remove_prefix(&local_20,sVar3);
      bVar2 = string_view::empty(&local_20);
      if ((bVar2) || (pcVar4 = string_view::front(&local_20), *pcVar4 == '}')) goto LAB_00113397;
      pcVar4 = string_view::front(&local_20);
    } while (*pcVar4 != '`');
    s._len = sVar5;
    s._ptr = pcVar6;
    sVar5 = size_between_balanced
                      (s,(char)((ulong)in_stack_ffffffffffffffb0 >> 0x38),
                       (char)((ulong)in_stack_ffffffffffffffb0 >> 0x30));
    str = string_view::data(&local_20);
    string_view::string_view((string_view *)&stack0xfffffffffffffff0,str,sVar5 - 1);
  }
LAB_001133b2:
  sVar1._len = (size_t)in_stack_fffffffffffffff8;
  sVar1._ptr = in_stack_fffffffffffffff0;
  return sVar1;
}

Assistant:

inline string_view resolve_recursive_tag(string_view full_tag, string_view intro)
{
  if (intro.empty()) { return {}; }

  while (! full_tag.empty())
  {
    const std::size_t intro_pos = full_tag.find(intro);
    full_tag.remove_prefix(intro_pos);
    full_tag.remove_prefix(intro.size());
    if (full_tag.empty()) { break; }
    if (full_tag.front() == '}') { break; } // empty struct
    if (full_tag.front() == '`') // definition found
    {
      const std::size_t size = size_between_balanced(full_tag, '{', '}');
      return string_view{full_tag.data(), size - 1};
    }
    // else: spurious find, e.g: found {FooBar for {Foo
  }

  return {};
}